

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpInputStream::Response> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readResponse
          (HttpInputStreamImpl *this,HttpMethod requestMethod)

{
  Coroutine<kj::HttpInputStream::Response> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar1;
  PromiseArenaMember *node;
  long lVar2;
  long *plVar3;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> coroutine;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  HttpInputStream local_68;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> WStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 local_38;
  
  coroutine._M_fr_ptr = operator_new(0x4e8);
  *(code **)coroutine._M_fr_ptr = readResponse;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readResponse;
  this_00 = (Coroutine<kj::HttpInputStream::Response> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4e0) = in_EDX;
  *(ulong *)((long)coroutine._M_fr_ptr + 0x4d8) = CONCAT44(in_register_00000034,requestMethod);
  local_58 = 0x587dd6;
  uStack_54 = 0;
  uStack_50 = 0x58980d;
  uStack_4c = 0;
  local_48 = 0x5a5;
  uStack_44 = 0x19;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da9b0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da9f8;
  location.function = "readResponse";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x5a5;
  location.columnNumber = 0x19;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x4d0);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da9b0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da9f8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  readResponseHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x268);
  co_await<kj::OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
             this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x4e4) = 0;
  bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar4) {
    kj::_::PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)
                 ((long)coroutine._M_fr_ptr + 0x460),__return_storage_ptr__);
    if ((*(char *)((long)coroutine._M_fr_ptr + 0x418) == '\x01') &&
       (*(int *)((long)coroutine._M_fr_ptr + 0x420) - 1U < 2)) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x420) = 0;
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x280) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x288));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
    if (node != (PromiseArenaMember *)0x0) {
      (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    if (((OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)
        ((long)coroutine._M_fr_ptr + 0x460))->tag != 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13]>
                ((Fault *)&stack0xffffffffffffff98,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5a8,FAILED,"responseOrProtocolError.tryGet<HttpHeaders::Response>() != nullptr",
                 "\"bad response\"",(char (*) [13])"bad response");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff98);
    }
    local_38 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4e0);
    lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x4d8);
    uVar1 = *(uint *)((long)coroutine._M_fr_ptr + 0x468);
    local_48 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x47c);
    local_58 = (undefined4)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x46c);
    uStack_54 = (undefined4)((ulong)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x46c) >> 0x20);
    uStack_50 = (undefined4)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x474);
    uStack_4c = (undefined4)((ulong)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x474) >> 0x20);
    local_40 = 1;
    getEntityBody((HttpInputStreamImpl *)&stack0xffffffffffffff98,(RequestOrResponse)lVar2,
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x1,(uint)&stack0xffffffffffffffc0
                  ,(HttpHeaders *)(ulong)uVar1);
    local_40 = 0;
    *(uint *)((long)coroutine._M_fr_ptr + 0x4a0) = uVar1;
    *(ulong *)((long)coroutine._M_fr_ptr + 0x4a8) = CONCAT44(uStack_50,uStack_54);
    *(ulong *)((long)coroutine._M_fr_ptr + 0x4b0) = CONCAT44(local_48,uStack_4c);
    *(long *)((long)coroutine._M_fr_ptr + 0x4b8) = lVar2 + 0x48;
    *(_func_int ***)((long)coroutine._M_fr_ptr + 0x4c0) = local_68._vptr_HttpInputStream;
    ((Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> *)
    ((long)coroutine._M_fr_ptr + 0x4c8))->ptr =
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)WStack_60.currentWrapper.ptr;
    WStack_60.currentWrapper.ptr =
         (Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>)
         (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
    kj::_::Coroutine<kj::HttpInputStream::Response>::fulfill
              (this_00,(FixVoid<kj::HttpInputStream::Response> *)((long)coroutine._M_fr_ptr + 0x4a0)
              );
    plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x4c8);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c8) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x4c0))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x4c0),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x4e4) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Response> readResponse(HttpMethod requestMethod) override {
    auto responseOrProtocolError = co_await readResponseHeaders();
    auto response = KJ_REQUIRE_NONNULL(
        responseOrProtocolError.tryGet<HttpHeaders::Response>(), "bad response");
    auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, requestMethod,
                              response.statusCode, headers);

    co_return { response.statusCode, response.statusText, headers, kj::mv(body) };
  }